

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::SListLeaf::remove
          (SListLeaf *this,char *__filename)

{
  int extraout_EAX;
  Lhs *in_stack_ffffffffffffffc8;
  SkipList<Inferences::ALASCA::SuperpositionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::LDComparator>
  *in_stack_ffffffffffffffd0;
  
  Inferences::ALASCA::SuperpositionConf::Lhs::Lhs
            ((Lhs *)&stack0xffffffffffffffbc,(Lhs *)&this->_children);
  Lib::
  SkipList<Inferences::ALASCA::SuperpositionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::LDComparator>
  ::remove<Inferences::ALASCA::SuperpositionConf::Lhs>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x49a154);
  return extraout_EAX;
}

Assistant:

void remove(LeafData ld) override { _children.remove(ld); }